

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O2

MPP_RET mpp_service_init(void *ctx,MppClientType type)

{
  int fd;
  MPP_RET MVar1;
  MPP_RET MVar2;
  MppServiceCmdCap *pMVar3;
  char *__file;
  void *pvVar4;
  MppClientType type_local;
  pthread_mutexattr_t attr;
  RK_U32 disable_rcb_info;
  
  type_local = type;
  pMVar3 = mpp_get_mpp_service_cmd_cap();
  *(MppServiceCmdCap **)((long)ctx + 0x180) = pMVar3;
  __file = mpp_get_mpp_service_name();
  fd = open64(__file,0x80002);
  *(int *)((long)ctx + 4) = fd;
  if (fd < 0) {
    _mpp_log_l(2,"mpp_serivce","open mpp_service failed\n",(char *)0x0);
    MVar1 = MPP_NOK;
  }
  else {
    MVar1 = mpp_service_ioctl(fd,0x100,4,&type_local);
    if (MVar1 != MPP_OK) {
      _mpp_log_l(2,"mpp_serivce","set client type %d failed\n",(char *)0x0,(ulong)type_local);
    }
    pMVar3 = *(MppServiceCmdCap **)((long)ctx + 0x180);
    if (pMVar3 == (MppServiceCmdCap *)0x0) {
      _mpp_log_l(2,"mpp_serivce","Assertion %s failed at %s:%d\n",(char *)0x0,"p->cap",
                 "mpp_service_init",0x144);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
      pMVar3 = *(MppServiceCmdCap **)((long)ctx + 0x180);
    }
    MVar2 = mpp_service_check_cmd_valid(0x403,pMVar3);
    if (MVar2 == MPP_OK) {
      *(undefined4 *)((long)ctx + 0x188) = 1;
    }
    MVar2 = mpp_service_check_cmd_valid(0x203,pMVar3);
    if (MVar2 == MPP_OK) {
      disable_rcb_info = 0;
      mpp_env_get_u32("disable_rcb_info",&disable_rcb_info,0);
      *(uint *)((long)ctx + 0x18c) = (uint)(disable_rcb_info == 0);
      pMVar3 = *(MppServiceCmdCap **)((long)ctx + 0x180);
    }
    MVar2 = mpp_service_check_cmd_valid(0x301,pMVar3);
    if (MVar2 == MPP_OK) {
      *(undefined4 *)((long)ctx + 400) = 1;
    }
    *(MppClientType *)ctx = type_local;
    *(undefined4 *)((long)ctx + 8) = *(undefined4 *)((long)ctx + 4);
    *(undefined4 *)((long)ctx + 0x18) = 0;
    *(undefined8 *)((long)ctx + 0x10) = 0;
    *(undefined8 *)((long)ctx + 0x20) = 0;
    *(undefined8 *)((long)ctx + 0x68) = 0;
    *(undefined4 *)((long)ctx + 0x70) = *(undefined4 *)((long)ctx + 4);
    *(undefined4 *)((long)ctx + 0x74) = 0;
    *(undefined4 *)((long)ctx + 0x30) = 0x10;
    pvVar4 = mpp_osal_malloc("mpp_service_init",0x180);
    *(void **)((long)ctx + 0x28) = pvVar4;
    if (pvVar4 == (void *)0x0) {
      _mpp_log_l(2,"mpp_serivce","create request buffer failed\n",(char *)0x0);
      MVar1 = MPP_ERR_MALLOC;
    }
    *(undefined4 *)((long)ctx + 0x40) = 0x40;
    pvVar4 = mpp_osal_malloc("mpp_service_init",0x200);
    *(void **)((long)ctx + 0x38) = pvVar4;
    if (pvVar4 == (void *)0x0) {
      _mpp_log_l(2,"mpp_serivce","create register offset buffer failed\n",(char *)0x0);
      MVar1 = MPP_ERR_MALLOC;
    }
    *(undefined8 *)((long)ctx + 0x44) = 0;
    *(undefined4 *)((long)ctx + 0x58) = 0x20;
    pvVar4 = mpp_osal_malloc("mpp_service_init",0x100);
    *(void **)((long)ctx + 0x50) = pvVar4;
    if (pvVar4 == (void *)0x0) {
      MVar1 = MPP_ERR_MALLOC;
      _mpp_log_l(2,"mpp_serivce","create rcb info buffer failed\n",(char *)0x0);
    }
    *(undefined8 *)((long)ctx + 0x5c) = 0;
    *(long *)((long)ctx + 0x1c0) = (long)ctx + 0x1c0;
    *(long *)((long)ctx + 0x1c8) = (long)ctx + 0x1c0;
    pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
    pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,1);
    pthread_mutex_init((pthread_mutex_t *)((long)ctx + 0x198),(pthread_mutexattr_t *)&attr);
    pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_service_init(void *ctx, MppClientType type)
{
    MppDevMppService *p = (MppDevMppService *)ctx;
    MPP_RET ret = MPP_NOK;

    p->cap = mpp_get_mpp_service_cmd_cap();
    p->client = open(mpp_get_mpp_service_name(), O_RDWR | O_CLOEXEC);
    if (p->client < 0) {
        mpp_err("open mpp_service failed\n");
        return ret;
    }

    /* set client type first */
    ret = mpp_service_ioctl(p->client, MPP_CMD_INIT_CLIENT_TYPE, sizeof(type), &type);
    if (ret)
        mpp_err("set client type %d failed\n", type);

    mpp_assert(p->cap);
    if (MPP_OK == mpp_service_check_cmd_valid(MPP_CMD_SEND_CODEC_INFO, p->cap))
        p->support_set_info = 1;
    if (MPP_OK == mpp_service_check_cmd_valid(MPP_CMD_SET_RCB_INFO, p->cap)) {
        RK_U32 disable_rcb_info = 0;

        mpp_env_get_u32("disable_rcb_info", &disable_rcb_info, 0);
        p->support_set_rcb_info = !disable_rcb_info;
    }
    if (MPP_OK == mpp_service_check_cmd_valid(MPP_CMD_POLL_HW_IRQ, p->cap))
        p->support_hw_irq = 1;

    /* default server fd is the opened client fd */
    p->client_type = type;
    p->server = p->client;
    p->batch_io = 0;
    p->serv_ctx = NULL;
    p->dev_cb   = NULL;

    p->bat_cmd.flag = 0;
    p->bat_cmd.client = p->client;
    p->bat_cmd.ret = 0;

    p->req_max = MAX_REQ_NUM;
    p->reqs = mpp_malloc(MppReqV1, p->req_max);
    if (NULL == p->reqs) {
        mpp_err("create request buffer failed\n");
        ret = MPP_ERR_MALLOC;
    }

    p->reg_offset_max = MAX_REG_OFFSET;
    p->reg_offset_info = mpp_malloc(RegOffsetInfo, p->reg_offset_max);
    if (NULL == p->reg_offset_info) {
        mpp_err("create register offset buffer failed\n");
        ret = MPP_ERR_MALLOC;
    }
    p->reg_offset_pos = 0;
    p->reg_offset_count = 0;

    p->rcb_max = MAX_RCB_OFFSET;
    p->rcb_info = mpp_malloc(RcbInfo, p->rcb_max);
    if (NULL == p->rcb_info) {
        mpp_err("create rcb info buffer failed\n");
        ret = MPP_ERR_MALLOC;
    }
    p->rcb_pos = 0;
    p->rcb_count = 0;

    INIT_LIST_HEAD(&p->list_bufs);
    {
        pthread_mutexattr_t attr;
        pthread_mutexattr_init(&attr);
        pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
        pthread_mutex_init(&p->lock_bufs, &attr);
        pthread_mutexattr_destroy(&attr);
    }
    return ret;
}